

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linquadlagrfe.cc
# Opt level: O3

int main(int argc,char **argv)

{
  size_type *this;
  pointer pcVar1;
  MeshFunctionReturnType<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>_>_>_>
  MVar2;
  MeshFunctionReturnType<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>_>_>
  MVar3;
  element_type *peVar4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  element_type *peVar8;
  element_type *peVar9;
  element_type *peVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *s;
  const_iterator cVar14;
  variable_value *operand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  ostream *poVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Scalar *pSVar17;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  PredicateTrue *pPVar19;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>
  *b;
  anon_class_1_0_00000001 *qr_selector;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>
  *extraout_RDX;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>
  *extraout_RDX_00;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>
  *b_00;
  anon_class_1_0_00000001 *qr_selector_00;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>
  *extraout_RDX_01;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>
  *extraout_RDX_02;
  anon_class_1_0_00000001 *qr_selector_01;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>
  *extraout_RDX_03;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>
  *extraout_RDX_04;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>
  *pMVar20;
  anon_class_1_0_00000001 *qr_selector_02;
  long row;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>_> fe_space_o2;
  shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> fe_space_o1;
  shared_ptr<const_lf::mesh::Mesh> mesh;
  _Head_base<0UL,_lf::mesh::MeshFactory_*,_false> local_690;
  string mesh_name;
  MatrixXd results;
  undefined1 local_648 [32];
  double local_628;
  double local_620;
  double local_618;
  double local_610;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>_>
  local_608;
  VectorXd solution_o2;
  VectorXd solution_o1;
  string output_file;
  path mesh_file;
  MeshFunctionGradFE<double,_double> local_560;
  MeshFunctionFE<double,_double> local_540;
  MeshFunctionGradFE<double,_double> local_520;
  string __str;
  void *local_4e0;
  DenseStorage<double,__1,__1,_1,_0> local_408;
  DenseStorage<double,__1,__1,_1,_0> local_3f8;
  DenseStorage<double,__1,__1,_1,_0> local_3e8;
  DenseStorage<double,__1,__1,_1,_0> local_3d8;
  ofstream file;
  undefined7 uStack_3c7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_3a0;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_370 [3];
  ios_base local_2d0 [264];
  options_description desc;
  path mesh_folder;
  path here;
  function1<std::pair<std::string,_std::string>,_const_std::string_&> local_f8;
  variables_map vm;
  
  _file = (pointer)&local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&file,"allowed options","");
  boost::program_options::options_description::options_description(&desc,(string *)&file,0x50,0x28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_file != &local_3b8) {
    operator_delete(_file,local_3b8._M_allocated_capacity + 1);
  }
  _file = (pointer)boost::program_options::options_description::add_options(&desc);
  s = boost::program_options::value<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  boost::program_options::options_description_easy_init::operator()
            ((options_description_easy_init *)&file,"output,o",(value_semantic *)s,
             "Name of the output file");
  boost::program_options::variables_map::variables_map(&vm);
  local_f8.super_function_base.vtable = (vtable_base *)0x0;
  local_f8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_f8.super_function_base.functor._8_8_ = 0;
  local_f8.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)&file,argc,argv,&desc,0,&local_f8);
  boost::program_options::store((parsed_options *)&file,&vm,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&file);
  boost::
  function_n<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function_n(&local_f8);
  _file = (pointer)&local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&file,"output","");
  cVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(&vm.
                   super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   ._M_t,(key_type *)&file);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_file != &local_3b8) {
    operator_delete(_file,local_3b8._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar14._M_node ==
      &vm.
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
       ._M_t._M_impl.super__Rb_tree_header) {
    poVar16 = boost::program_options::operator<<((ostream *)&std::cout,&desc);
    file = (ofstream)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,(char *)&file,1);
    iVar13 = 1;
  }
  else {
    _file = (pointer)&local_3b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&file,"output","");
    operand = boost::program_options::abstract_variables_map::operator[]
                        (&vm.super_abstract_variables_map,(string *)&file);
    pbVar15 = boost::any_cast<std::__cxx11::string_const&>(&operand->v);
    output_file._M_dataplus._M_p = (pointer)&output_file.field_2;
    pcVar1 = (pbVar15->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&output_file,pcVar1,pcVar1 + pbVar15->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_file != &local_3b8) {
      operator_delete(_file,local_3b8._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::path<char[129],std::filesystem::__cxx11::path>
              (&here,(char (*) [129])
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/convergencestudies/linquadlagrfe.cc"
               ,auto_format);
    std::filesystem::__cxx11::path::parent_path();
    std::filesystem::__cxx11::path::path<char[7],std::filesystem::__cxx11::path>
              ((path *)&__str,(char (*) [7])0x38f527,auto_format);
    std::filesystem::__cxx11::operator/(&mesh_folder,(path *)&file,(path *)&__str);
    std::filesystem::__cxx11::path::~path((path *)&__str);
    std::filesystem::__cxx11::path::~path((path *)&file);
    results.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    results.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
    results.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              (&results.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,7,7);
    row = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"> Mesh Nr. ",0xb);
      poVar16 = (ostream *)std::ostream::operator<<(&std::cout,(uint)row);
      file = (ofstream)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,(char *)&file,1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\t> Loading Mesh",0xf);
      file = (ofstream)0xa;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&file,1);
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__str,1,'-');
      std::__detail::__to_chars_10_impl<unsigned_int>(__str._M_dataplus._M_p,1,(uint)row);
      iVar13 = 10;
      pbVar15 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__str,
                        0,0,"unitsquare",10);
      _file = (pbVar15->_M_dataplus)._M_p;
      paVar18 = &pbVar15->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_file == paVar18) {
        local_3b8._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_3b8._8_8_ = *(undefined8 *)((long)&pbVar15->field_2 + 8);
        _file = (pointer)&local_3b8;
      }
      else {
        local_3b8._M_allocated_capacity = paVar18->_M_allocated_capacity;
      }
      local_3c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar15->_M_string_length;
      (pbVar15->_M_dataplus)._M_p = (pointer)paVar18;
      pbVar15->_M_string_length = 0;
      (pbVar15->field_2)._M_local_buf[0] = '\0';
      pbVar15 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                       ".msh");
      mesh_name._M_dataplus._M_p = (pointer)&mesh_name.field_2;
      pcVar1 = (pbVar15->_M_dataplus)._M_p;
      paVar18 = &pbVar15->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 == paVar18) {
        mesh_name.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
        mesh_name.field_2._8_8_ = *(undefined8 *)((long)&pbVar15->field_2 + 8);
      }
      else {
        mesh_name.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
        mesh_name._M_dataplus._M_p = pcVar1;
      }
      mesh_name._M_string_length = pbVar15->_M_string_length;
      (pbVar15->_M_dataplus)._M_p = (pointer)paVar18;
      pbVar15->_M_string_length = 0;
      (pbVar15->field_2)._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_file != &local_3b8) {
        operator_delete(_file,local_3b8._M_allocated_capacity + 1);
      }
      paVar18 = &__str.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar18) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)&file,&mesh_name,auto_format);
      std::filesystem::__cxx11::operator/(&mesh_file,&mesh_folder,(path *)&file);
      std::filesystem::__cxx11::path::~path((path *)&file);
      local_690._M_head_impl = (MeshFactory *)operator_new(0x60);
      (local_690._M_head_impl)->_vptr_MeshFactory = (_func_int **)&PTR_DimWorld_00454160;
      *(undefined4 *)&local_690._M_head_impl[1]._vptr_MeshFactory = 2;
      local_690._M_head_impl[2]._vptr_MeshFactory = (_func_int **)0x0;
      local_690._M_head_impl[3]._vptr_MeshFactory = (_func_int **)0x0;
      local_690._M_head_impl[4]._vptr_MeshFactory = (_func_int **)0x0;
      local_690._M_head_impl[5]._vptr_MeshFactory = (_func_int **)0x0;
      local_690._M_head_impl[6]._vptr_MeshFactory = (_func_int **)0x0;
      local_690._M_head_impl[7]._vptr_MeshFactory = (_func_int **)0x0;
      local_690._M_head_impl[8]._vptr_MeshFactory = (_func_int **)0x0;
      local_690._M_head_impl[9]._vptr_MeshFactory = (_func_int **)0x0;
      local_690._M_head_impl[10]._vptr_MeshFactory = (_func_int **)0x0;
      *(undefined1 *)&local_690._M_head_impl[0xb]._vptr_MeshFactory = 1;
      __str._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&__str,mesh_file._M_pathname._M_dataplus._M_p,
                 mesh_file._M_pathname._M_dataplus._M_p + mesh_file._M_pathname._M_string_length);
      lf::io::GmshReader::GmshReader
                ((GmshReader *)&file,
                 (unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *)
                 &local_690,&__str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar18) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      if (local_690._M_head_impl != (MeshFactory *)0x0) {
        (*(local_690._M_head_impl)->_vptr_MeshFactory[7])();
      }
      local_690._M_head_impl = (MeshFactory *)0x0;
      mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_file;
      mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_3c0._M_pi;
      if ((pointer)local_3c0._M_pi != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_3c0._M_pi)->_M_use_count = (int)*(size_type *)&(local_3c0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_3c0._M_pi)->_M_use_count = (int)*(size_type *)&(local_3c0._M_pi)->_M_use_count + 1;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\t> Linear Lagrangian FE",0x17);
      fe_space_o1.
      super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<lf::uscalfe::FeSpaceLagrangeO1<double>,std::allocator<lf::uscalfe::FeSpaceLagrangeO1<double>>,std::shared_ptr<lf::mesh::Mesh_const>const&>
                (&fe_space_o1.
                  super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(FeSpaceLagrangeO1<double> **)&fe_space_o1,
                 (allocator<lf::uscalfe::FeSpaceLagrangeO1<double>_> *)&__str,&mesh);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
      iVar11 = (*((fe_space_o1.
                   super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super_UniformScalarFESpace<double>).super_ScalarFESpace<double>.
                 _vptr_ScalarFESpace[1])();
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar11) + 0x10))
                ((long *)CONCAT44(extraout_var,iVar11));
      poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," DOFs)",6);
      __str._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,(char *)&__str,1);
      __str._M_dataplus._M_p =
           (pointer)fe_space_o1.
                    super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
      __str._M_string_length =
           (size_type)
           fe_space_o1.
           super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (fe_space_o1.
          super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (fe_space_o1.
           super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (fe_space_o1.
                super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (fe_space_o1.
           super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (fe_space_o1.
                super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      solvePoisson((shared_ptr<const_lf::mesh::Mesh> *)&solution_o1,
                   (shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *)&mesh);
      if (__str._M_string_length != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__str._M_string_length);
      }
      _Var6._M_pi = fe_space_o1.
                    super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      peVar8 = fe_space_o1.
               super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (fe_space_o1.
          super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (fe_space_o1.
           super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (fe_space_o1.
                super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (fe_space_o1.
           super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (fe_space_o1.
                super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                (&local_3d8,(DenseStorage<double,__1,__1,_1,_0> *)&solution_o1);
      _Var7 = fe_space_o1.
              super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
      peVar9 = fe_space_o1.
               super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_648._0_8_ = peVar8;
      local_648._8_8_ = _Var6._M_pi;
      local_648._16_8_ = local_3d8.m_data;
      local_648._24_8_ = local_3d8.m_rows;
      local_3d8.m_data = (double *)0x0;
      local_3d8.m_rows = 0;
      if (fe_space_o1.
          super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (fe_space_o1.
           super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (fe_space_o1.
                super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (fe_space_o1.
           super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (fe_space_o1.
                super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                (&local_3e8,(DenseStorage<double,__1,__1,_1,_0> *)&solution_o1);
      local_520.fe_space_.
      super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)peVar9;
      local_520.fe_space_.
      super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var7._M_pi;
      local_520.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
      .m_data = local_3e8.m_data;
      local_520.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
      .m_rows = local_3e8.m_rows;
      local_3e8.m_data = (double *)0x0;
      local_3e8.m_rows = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\t> Quadratic Lagrangian FE",0x1a);
      fe_space_o2.
      super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<lf::uscalfe::FeSpaceLagrangeO2<double>,std::allocator<lf::uscalfe::FeSpaceLagrangeO2<double>>,std::shared_ptr<lf::mesh::Mesh_const>const&>
                (&fe_space_o2.
                  super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(FeSpaceLagrangeO2<double> **)&fe_space_o2,
                 (_Sp_alloc_shared_tag<std::allocator<lf::uscalfe::FeSpaceLagrangeO2<double>_>_>)
                 &__str,&mesh);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
      iVar11 = (*((fe_space_o2.
                   super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super_UniformScalarFESpace<double>).super_ScalarFESpace<double>.
                 _vptr_ScalarFESpace[1])();
      (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar11) + 0x10))
                ((long *)CONCAT44(extraout_var_00,iVar11));
      poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," DOFs)",6);
      __str._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,(char *)&__str,1);
      __str._M_dataplus._M_p =
           (pointer)fe_space_o2.
                    super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
      __str._M_string_length =
           (size_type)
           fe_space_o2.
           super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      pPVar19 = (PredicateTrue *)
                fe_space_o2.
                super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      if (fe_space_o2.
          super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        pPVar19 = (PredicateTrue *)&__libc_single_threaded;
        if (__libc_single_threaded == '\0') {
          LOCK();
          (fe_space_o2.
           super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (fe_space_o2.
                super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (fe_space_o2.
           super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (fe_space_o2.
                super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      solvePoisson((shared_ptr<const_lf::mesh::Mesh> *)&solution_o2,
                   (shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *)&mesh);
      if (__str._M_string_length != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__str._M_string_length);
      }
      _Var6._M_pi = fe_space_o2.
                    super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      peVar4 = fe_space_o2.
               super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (fe_space_o2.
          super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (fe_space_o2.
           super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (fe_space_o2.
                super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (fe_space_o2.
           super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (fe_space_o2.
                super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                (&local_3f8,(DenseStorage<double,__1,__1,_1,_0> *)&solution_o2);
      _Var7 = fe_space_o2.
              super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
      peVar5 = fe_space_o2.
               super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_540.fe_space_.
      super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)peVar4;
      local_540.fe_space_.
      super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var6._M_pi;
      local_540.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
      .m_data = local_3f8.m_data;
      local_540.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
      .m_rows = local_3f8.m_rows;
      local_3f8.m_data = (double *)0x0;
      local_3f8.m_rows = 0;
      if (fe_space_o2.
          super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (fe_space_o2.
           super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (fe_space_o2.
                super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (fe_space_o2.
           super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (fe_space_o2.
                super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                (&local_408,(DenseStorage<double,__1,__1,_1,_0> *)&solution_o2);
      local_560.fe_space_.
      super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)peVar5;
      local_560.fe_space_.
      super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var7._M_pi;
      local_560.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
      .m_data = local_408.m_data;
      local_560.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
      .m_rows = local_408.m_rows;
      local_408.m_data = (double *)0x0;
      local_408.m_rows = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\t> Computing Error Norms",0x18);
      __str._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&__str,1);
      peVar10 = mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lf::mesh::utils::
      operator-<lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>_>
                (&local_608,&local_520,b);
      lf::mesh::utils::
      squaredNorm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>_>_>
                ((MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>_>_>
                  *)&__str,&local_608);
      MVar2 = lf::fe::
              IntegrateMeshFunction<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:165:36),_lf::base::PredicateTrue>
                        (peVar10,(MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>_>_>
                                  *)&__str,qr_selector,pPVar19,iVar13);
      if (MVar2 < 0.0) {
        local_610 = sqrt(MVar2);
      }
      else {
        local_610 = SQRT(MVar2);
      }
      free(local_4e0);
      if (__str.field_2._8_8_ != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__str.field_2._8_8_);
      }
      free(local_608.a_.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      b_00 = extraout_RDX;
      if (local_608.a_.fe_space_.
          super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_608.a_.fe_space_.
                   super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
        b_00 = extraout_RDX_00;
      }
      peVar10 = mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lf::mesh::utils::
      operator-<lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>_>
                (&local_608,&local_560,b_00);
      lf::mesh::utils::
      squaredNorm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>_>_>
                ((MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>_>_>
                  *)&__str,&local_608);
      MVar2 = lf::fe::
              IntegrateMeshFunction<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:165:36),_lf::base::PredicateTrue>
                        (peVar10,(MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>_>_>
                                  *)&__str,qr_selector_00,pPVar19,iVar13);
      if (MVar2 < 0.0) {
        local_618 = sqrt(MVar2);
      }
      else {
        local_618 = SQRT(MVar2);
      }
      free(local_4e0);
      if (__str.field_2._8_8_ != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__str.field_2._8_8_);
      }
      free(local_608.a_.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      pMVar20 = extraout_RDX_01;
      if (local_608.a_.fe_space_.
          super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_608.a_.fe_space_.
                   super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
        pMVar20 = extraout_RDX_02;
      }
      peVar10 = mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lf::mesh::utils::
      operator-<lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>
                ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>
                  *)&local_608,(MeshFunctionFE<double,_double> *)local_648,pMVar20);
      lf::mesh::utils::
      squaredNorm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>_>
                ((MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>_>
                  *)&__str,
                 (MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>
                  *)&local_608);
      MVar3 = lf::fe::
              IntegrateMeshFunction<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:165:36),_lf::base::PredicateTrue>
                        (peVar10,(MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>_>
                                  *)&__str,qr_selector_01,pPVar19,iVar13);
      if (MVar3 < 0.0) {
        local_620 = sqrt(MVar3);
      }
      else {
        local_620 = SQRT(MVar3);
      }
      free(local_4e0);
      if (__str.field_2._8_8_ != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__str.field_2._8_8_);
      }
      free(local_608.a_.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      pMVar20 = extraout_RDX_03;
      if (local_608.a_.fe_space_.
          super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_608.a_.fe_space_.
                   super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
        pMVar20 = extraout_RDX_04;
      }
      peVar10 = mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lf::mesh::utils::
      operator-<lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>
                ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>
                  *)&local_608,&local_540,pMVar20);
      lf::mesh::utils::
      squaredNorm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>_>
                ((MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>_>
                  *)&__str,
                 (MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>
                  *)&local_608);
      MVar3 = lf::fe::
              IntegrateMeshFunction<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:165:36),_lf::base::PredicateTrue>
                        (peVar10,(MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>_>
                                  *)&__str,qr_selector_02,pPVar19,iVar13);
      if (MVar3 < 0.0) {
        local_628 = sqrt(MVar3);
      }
      else {
        local_628 = SQRT(MVar3);
      }
      free(local_4e0);
      if (__str.field_2._8_8_ != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__str.field_2._8_8_);
      }
      free(local_608.a_.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      if (local_608.a_.fe_space_.
          super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_608.a_.fe_space_.
                   super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      uVar12 = (*(mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->_vptr_Mesh[3])(mesh.
                                  super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,0);
      pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&results,
                           row,0);
      *pSVar17 = SQRT(1.0 / (double)uVar12);
      iVar13 = (*((fe_space_o1.
                   super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super_UniformScalarFESpace<double>).super_ScalarFESpace<double>.
                 _vptr_ScalarFESpace[1])();
      uVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar13) + 0x10))
                         ((long *)CONCAT44(extraout_var_01,iVar13));
      pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&results,
                           row,1);
      *pSVar17 = (double)uVar12;
      iVar13 = (*((fe_space_o2.
                   super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super_UniformScalarFESpace<double>).super_ScalarFESpace<double>.
                 _vptr_ScalarFESpace[1])();
      uVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar13) + 0x10))
                         ((long *)CONCAT44(extraout_var_02,iVar13));
      pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&results,
                           row,2);
      *pSVar17 = (double)uVar12;
      pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&results,
                           row,3);
      *pSVar17 = local_610;
      pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&results,
                           row,4);
      *pSVar17 = local_618;
      pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&results,
                           row,5);
      *pSVar17 = local_620;
      pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&results,
                           row,6);
      *pSVar17 = local_628;
      free(local_560.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      if (local_560.fe_space_.
          super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_560.fe_space_.
                   super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      free(local_540.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      if (local_540.fe_space_.
          super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_540.fe_space_.
                   super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      free(solution_o2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
      if (fe_space_o2.
          super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (fe_space_o2.
                   super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      free(local_520.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      if (local_520.fe_space_.
          super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_520.fe_space_.
                   super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      free((void *)local_648._16_8_);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_648._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_648._8_8_);
      }
      free(solution_o1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
      if (fe_space_o1.
          super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (fe_space_o1.
                   super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
      ::~_Rb_tree(local_370);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::~_Rb_tree(&local_3a0);
      if (local_3a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a8._M_pi);
      }
      if ((long *)local_3b8._M_allocated_capacity != (long *)0x0) {
        (**(code **)(*(long *)local_3b8._M_allocated_capacity + 0x38))();
      }
      local_3b8._M_allocated_capacity = 0;
      if ((pointer)local_3c0._M_pi != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c0._M_pi);
      }
      std::filesystem::__cxx11::path::~path(&mesh_file);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)mesh_name._M_dataplus._M_p != &mesh_name.field_2) {
        operator_delete(mesh_name._M_dataplus._M_p,mesh_name.field_2._M_allocated_capacity + 1);
      }
      row = row + 1;
    } while (row != 7);
    if (main::CSVFormat == '\0') {
      iVar13 = __cxa_guard_acquire(&main::CSVFormat);
      if (iVar13 != 0) {
        _file = (pointer)&local_3b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&file,", ","");
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"\n","");
        local_608._0_8_ = (long)&local_608 + 0x10U;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"");
        paVar18 = &mesh_file._M_pathname.field_2;
        mesh_file._M_pathname._M_dataplus._M_p = (pointer)paVar18;
        std::__cxx11::string::_M_construct<char_const*>((string *)&mesh_file,"");
        mesh_name._M_dataplus._M_p = (pointer)&mesh_name.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&mesh_name,"");
        local_648._0_8_ = (element_type *)(local_648 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_648,"");
        Eigen::IOFormat::IOFormat
                  (&main::CSVFormat,-1,1,(string *)&file,&__str,(string *)&local_608,
                   &mesh_file._M_pathname,&mesh_name,(string *)local_648,' ');
        if ((element_type *)local_648._0_8_ != (element_type *)(local_648 + 0x10)) {
          operator_delete((void *)local_648._0_8_,local_648._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)mesh_name._M_dataplus._M_p != &mesh_name.field_2) {
          operator_delete(mesh_name._M_dataplus._M_p,mesh_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)mesh_file._M_pathname._M_dataplus._M_p != paVar18) {
          operator_delete(mesh_file._M_pathname._M_dataplus._M_p,
                          mesh_file._M_pathname.field_2._M_allocated_capacity + 1);
        }
        if (local_608._0_8_ != (long)&local_608 + 0x10U) {
          operator_delete((void *)local_608._0_8_,
                          (ulong)((long)local_608.a_.fe_space_.
                                        super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_file != &local_3b8) {
          operator_delete(_file,local_3b8._M_allocated_capacity + 1);
        }
        __cxa_atexit(Eigen::IOFormat::~IOFormat,&main::CSVFormat,&__dso_handle);
        __cxa_guard_release(&main::CSVFormat);
      }
    }
    std::ofstream::ofstream(&file);
    std::ofstream::open((string *)&file,(_Ios_Openmode)&output_file);
    this = &__str._M_string_length;
    __str._M_dataplus._M_p = (pointer)&results;
    Eigen::IOFormat::IOFormat((IOFormat *)this,&main::CSVFormat);
    Eigen::internal::print_matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((ostream *)&file,(Matrix<double,__1,__1,_0,__1,__1> *)__str._M_dataplus._M_p,
               (IOFormat *)this);
    Eigen::IOFormat::~IOFormat((IOFormat *)this);
    std::ofstream::close();
    _file = _VTT;
    *(undefined8 *)(&file + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)&local_3c0);
    std::ios_base::~ios_base(local_2d0);
    free(results.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    std::filesystem::__cxx11::path::~path(&mesh_folder);
    std::filesystem::__cxx11::path::~path(&here);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)output_file._M_dataplus._M_p != &output_file.field_2) {
      operator_delete(output_file._M_dataplus._M_p,output_file.field_2._M_allocated_capacity + 1);
    }
    iVar13 = 0;
  }
  vm.super_abstract_variables_map._vptr_abstract_variables_map =
       (_func_int **)&PTR__variables_map_00453320;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vm.m_required._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&vm.m_final._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(&vm.
               super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ._M_t);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(&desc.groups);
  if (desc.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(desc.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)desc.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)desc.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    desc.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    desc.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_offset = 0;
    desc.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    desc.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_offset = 0;
    desc.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(&desc.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)desc.m_caption._M_dataplus._M_p != &desc.m_caption.field_2) {
    operator_delete(desc.m_caption._M_dataplus._M_p,desc.m_caption.field_2._M_allocated_capacity + 1
                   );
  }
  return iVar13;
}

Assistant:

int main(int argc, char *argv[]) {
  const int num_meshes = 7;

  po::options_description desc("allowed options");
  desc.add_options()("output,o", po::value<std::string>(),
                     "Name of the output file");
  po::variables_map vm;
  po::store(po::parse_command_line(argc, argv, desc), vm);
  if (vm.count("output") == 0) {
    std::cout << desc << '\n';
    return 1;
  }
  const std::string output_file = vm["output"].as<std::string>();

  // The analytic solution
  const auto u = [](const Eigen::VectorXd &x) -> double {
    return std::sin(lf::base::kPi * x[0]) * std::sin(lf::base::kPi * x[1]);
  };
  const lf::mesh::utils::MeshFunctionGlobal mf_u(u);
  // The gradient of the analytic solution
  const auto u_grad = [](const Eigen::Vector2d &x) -> Eigen::Vector2d {
    Eigen::Vector2d grad;
    grad[0] = lf::base::kPi * std::cos(lf::base::kPi * x[0]) *
              std::sin(lf::base::kPi * x[1]);
    grad[1] = lf::base::kPi * std::sin(lf::base::kPi * x[0]) *
              std::cos(lf::base::kPi * x[1]);
    return grad;
  };
  const lf::mesh::utils::MeshFunctionGlobal mf_u_grad(u_grad);

  const std::filesystem::path here = __FILE__;
  const std::filesystem::path mesh_folder = here.parent_path() / "meshes";
  Eigen::MatrixXd results(num_meshes, 7);
  for (int mesh_idx = 0; mesh_idx < num_meshes; ++mesh_idx) {
    std::cout << "> Mesh Nr. " << mesh_idx << '\n';

    // Load the mesh
    std::cout << "\t> Loading Mesh" << '\n';
    const std::string mesh_name =
        "unitsquare" + std::to_string(mesh_idx) + ".msh";
    const std::filesystem::path mesh_file = mesh_folder / mesh_name;
    auto factory = std::make_unique<lf::mesh::hybrid2d::MeshFactory>(2);
    const lf::io::GmshReader reader(std::move(factory), mesh_file.string());
    const auto mesh = reader.mesh();

    // Solve the problem with linear finite elements
    std::cout << "\t> Linear Lagrangian FE";
    const auto fe_space_o1 =
        std::make_shared<lf::uscalfe::FeSpaceLagrangeO1<double>>(mesh);
    std::cout << " (" << fe_space_o1->LocGlobMap().NumDofs() << " DOFs)"
              << '\n';
    const Eigen::VectorXd solution_o1 = solvePoisson(mesh, fe_space_o1);
    const lf::fe::MeshFunctionFE<double, double> mf_o1(fe_space_o1,
                                                       solution_o1);
    const lf::fe::MeshFunctionGradFE<double, double> mf_grad_o1(fe_space_o1,
                                                                solution_o1);

    // Solve the problem with quadratic finite elements
    std::cout << "\t> Quadratic Lagrangian FE";
    const auto fe_space_o2 =
        std::make_shared<lf::uscalfe::FeSpaceLagrangeO2<double>>(mesh);
    std::cout << " (" << fe_space_o2->LocGlobMap().NumDofs() << " DOFs)"
              << '\n';
    const Eigen::VectorXd solution_o2 = solvePoisson(mesh, fe_space_o2);
    const lf::fe::MeshFunctionFE<double, double> mf_o2(fe_space_o2,
                                                       solution_o2);
    const lf::fe::MeshFunctionGradFE<double, double> mf_grad_o2(fe_space_o2,
                                                                solution_o2);

    // Compute the H1 and L2 errors
    std::cout << "\t> Computing Error Norms" << '\n';
    const auto quadrule_provider = [](const lf::mesh::Entity &entity) {
      return lf::quad::make_QuadRule(entity.RefEl(), 6);
    };
    const double H1_err_o1 = std::sqrt(lf::fe::IntegrateMeshFunction(
        *mesh, lf::mesh::utils::squaredNorm(mf_grad_o1 - mf_u_grad),
        quadrule_provider));
    const double H1_err_o2 = std::sqrt(lf::fe::IntegrateMeshFunction(
        *mesh, lf::mesh::utils::squaredNorm(mf_grad_o2 - mf_u_grad),
        quadrule_provider));
    const double L2_err_o1 = std::sqrt(lf::fe::IntegrateMeshFunction(
        *mesh, lf::mesh::utils::squaredNorm(mf_o1 - mf_u), quadrule_provider));
    const double L2_err_o2 = std::sqrt(lf::fe::IntegrateMeshFunction(
        *mesh, lf::mesh::utils::squaredNorm(mf_o2 - mf_u), quadrule_provider));

    // Store the mesh width, the number of DOFs and the errors in the results
    // matrix
    results(mesh_idx, 0) = std::sqrt(1. / mesh->NumEntities(0));
    results(mesh_idx, 1) = fe_space_o1->LocGlobMap().NumDofs();
    results(mesh_idx, 2) = fe_space_o2->LocGlobMap().NumDofs();
    results(mesh_idx, 3) = H1_err_o1;
    results(mesh_idx, 4) = H1_err_o2;
    results(mesh_idx, 5) = L2_err_o1;
    results(mesh_idx, 6) = L2_err_o2;
  }

  // Output the resulting errors to a file
  const static Eigen::IOFormat CSVFormat(Eigen::StreamPrecision,
                                         Eigen::DontAlignCols, ", ", "\n");
  std::ofstream file;
  file.open(output_file);
  file << results.format(CSVFormat);
  file.close();

  return 0;
}